

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSystemSpecific.cpp
# Opt level: O2

void __thiscall Imf_2_5::CpuId::CpuId(CpuId *this)

{
  int *piVar1;
  long lVar2;
  uint uVar3;
  byte bVar4;
  uint in_XCR0;
  
  this->sse4_1 = false;
  this->sse4_2 = false;
  this->avx = false;
  this->f16c = false;
  this->sse2 = false;
  this->sse3 = false;
  this->ssse3 = false;
  this->sse4_1 = false;
  piVar1 = (int *)cpuid_basic_info(0);
  if (0 < *piVar1) {
    lVar2 = cpuid_Version_info(1);
    uVar3 = *(uint *)(lVar2 + 0xc);
    this->sse2 = (bool)((byte)((uint)*(undefined4 *)(lVar2 + 8) >> 0x1a) & 1);
    this->sse3 = (bool)((byte)uVar3 & 1);
    this->ssse3 = (bool)((byte)(uVar3 >> 9) & 1);
    this->sse4_1 = (bool)((byte)(uVar3 >> 0x13) & 1);
    this->sse4_2 = (bool)((byte)(uVar3 >> 0x14) & 1);
    bVar4 = (byte)(uVar3 >> 0x18);
    this->avx = (bool)(bVar4 >> 4 & 1);
    this->f16c = (bool)(bVar4 >> 5 & 1);
    if (((uVar3 >> 0x1b & 1) == 0) || ((~in_XCR0 & 6) != 0)) {
      this->avx = false;
      this->f16c = false;
    }
  }
  return;
}

Assistant:

CpuId::CpuId():
    sse2(false), 
    sse3(false), 
    ssse3(false),
    sse4_1(false), 
    sse4_2(false), 
    avx(false), 
    f16c(false)
{
    bool osxsave = false;
    int  max     = 0;
    int  eax, ebx, ecx, edx;

    cpuid(0, max, ebx, ecx, edx);
    if (max > 0)
    {
        cpuid(1, eax, ebx, ecx, edx);
        sse2    = ( edx & (1<<26) );
        sse3    = ( ecx & (1<< 0) );
        ssse3   = ( ecx & (1<< 9) );
        sse4_1  = ( ecx & (1<<19) );
        sse4_2  = ( ecx & (1<<20) );
        osxsave = ( ecx & (1<<27) );
        avx     = ( ecx & (1<<28) );
        f16c    = ( ecx & (1<<29) );

        if (!osxsave)
        {
            avx = f16c = false;
        }
        else
        {
            xgetbv(0, eax, edx);
            // eax bit 1 - SSE managed, bit 2 - AVX managed
            if ((eax & 6) != 6)
            {
                avx = f16c = false;
            }
        }
    }
}